

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall
wasm::OptimizationOptions::OptimizationOptions
          (OptimizationOptions *this,string *command,string *description)

{
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  string local_13c0 [32];
  anon_class_40_2_fd512ddd local_13a0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1378;
  allocator<char> local_1351;
  string local_1350 [32];
  string local_1330 [32];
  string local_1310 [39];
  allocator<char> local_12e9;
  string local_12e8 [39];
  allocator<char> local_12c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a0;
  reference local_1280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1240;
  allocator<char> local_1219;
  string local_1218 [39];
  allocator<char> local_11f1;
  string local_11f0 [39];
  allocator<char> local_11c9;
  string local_11c8 [39];
  allocator<char> local_11a1;
  string local_11a0 [32];
  anon_class_8_1_8991fb9c local_1180;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1178;
  allocator<char> local_1151;
  string local_1150 [39];
  allocator<char> local_1129;
  string local_1128 [39];
  allocator<char> local_1101;
  string local_1100 [39];
  allocator<char> local_10d9;
  string local_10d8 [32];
  anon_class_8_1_8991fb9c local_10b8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_10b0;
  allocator<char> local_1089;
  string local_1088 [39];
  allocator<char> local_1061;
  string local_1060 [39];
  allocator<char> local_1039;
  string local_1038 [39];
  allocator<char> local_1011;
  string local_1010 [32];
  anon_class_8_1_8991fb9c local_ff0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_fe8;
  allocator<char> local_fc1;
  string local_fc0 [39];
  allocator<char> local_f99;
  string local_f98 [39];
  allocator<char> local_f71;
  string local_f70 [39];
  allocator<char> local_f49;
  string local_f48 [32];
  anon_class_8_1_8991fb9c local_f28;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f20;
  allocator<char> local_ef9;
  string local_ef8 [39];
  allocator<char> local_ed1;
  string local_ed0 [39];
  allocator<char> local_ea9;
  string local_ea8 [39];
  allocator<char> local_e81;
  string local_e80 [32];
  anon_class_8_1_8991fb9c local_e60;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e58;
  allocator<char> local_e31;
  string local_e30 [39];
  allocator<char> local_e09;
  string local_e08 [39];
  allocator<char> local_de1;
  string local_de0 [39];
  allocator<char> local_db9;
  string local_db8 [32];
  anon_class_8_1_8991fb9c local_d98;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_d90;
  allocator<char> local_d69;
  string local_d68 [32];
  InliningOptions local_d48;
  string local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  allocator<char> local_cc1;
  string local_cc0 [39];
  allocator<char> local_c99;
  string local_c98 [32];
  anon_class_8_1_8991fb9c local_c78;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c70;
  allocator<char> local_c49;
  string local_c48 [39];
  allocator<char> local_c21;
  string local_c20 [39];
  allocator<char> local_bf9;
  string local_bf8 [39];
  allocator<char> local_bd1;
  string local_bd0 [32];
  anon_class_8_1_8991fb9c local_bb0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ba8;
  allocator<char> local_b81;
  string local_b80 [39];
  allocator<char> local_b59;
  string local_b58 [39];
  allocator<char> local_b31;
  string local_b30 [39];
  allocator<char> local_b09;
  string local_b08 [32];
  anon_class_8_1_8991fb9c local_ae8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ae0;
  allocator<char> local_ab9;
  string local_ab8 [32];
  InliningOptions local_a98;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  allocator<char> local_a31;
  string local_a30 [39];
  allocator<char> local_a09;
  string local_a08 [32];
  anon_class_8_1_8991fb9c local_9e8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9e0;
  allocator<char> local_9b9;
  string local_9b8 [32];
  InliningOptions local_998;
  string local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  allocator<char> local_911;
  string local_910 [39];
  allocator<char> local_8e9;
  string local_8e8 [32];
  anon_class_8_1_8991fb9c local_8c8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_8c0;
  allocator<char> local_899;
  string local_898 [39];
  allocator<char> local_871;
  string local_870 [39];
  allocator<char> local_849;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [32];
  anon_class_8_1_8991fb9c local_800;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7f8;
  allocator<char> local_7d1;
  string local_7d0 [39];
  allocator<char> local_7a9;
  string local_7a8 [39];
  allocator<char> local_781;
  string local_780 [39];
  allocator<char> local_759;
  string local_758 [32];
  anon_class_8_1_8991fb9c local_738;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_730;
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [39];
  allocator<char> local_6b9;
  string local_6b8 [39];
  allocator<char> local_691;
  string local_690 [32];
  anon_class_8_1_8991fb9c local_670;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_668;
  allocator<char> local_641;
  string local_640 [39];
  allocator<char> local_619;
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [39];
  allocator<char> local_5c9;
  string local_5c8 [32];
  anon_class_8_1_8991fb9c local_5a8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5a0;
  allocator<char> local_579;
  string local_578 [39];
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [32];
  anon_class_8_1_8991fb9c local_4e0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4d8;
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [39];
  allocator<char> local_439;
  string local_438 [32];
  anon_class_8_1_8991fb9c local_418;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_410;
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [32];
  anon_class_8_1_8991fb9c local_350;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [32];
  anon_class_8_1_8991fb9c local_288;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_280;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  anon_class_8_1_8991fb9c local_1c0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  anon_class_8_1_8991fb9c local_f8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  string *local_20;
  string *description_local;
  string *command_local;
  OptimizationOptions *this_local;
  
  local_20 = description;
  description_local = command;
  command_local = (string *)this;
  ToolOptions::ToolOptions(&this->super_ToolOptions,command,description);
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::vector(&this->passes);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"-O",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"execute default optimization passes (equivalent to -Os)",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Optimization options",&local_c9);
  local_f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_1_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f0,&local_f8);
  psVar2 = (string *)
           ::wasm::Options::add
                     ((string *)this,local_40,local_78,local_a0,(Arguments)local_c8,(function *)0x0,
                      SUB81(&local_f0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"-O0",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"execute no optimization passes",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"Optimization options",&local_191);
  local_1c0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_2_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1b8,&local_1c0);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_118,local_140,local_168,(Arguments)local_190,(function *)0x0,
                      SUB81(&local_1b8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"-O1",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,
             "execute -O1 optimization passes (quick&useful opts, useful for iteration builds)",
             &local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Optimization options",&local_259);
  local_288.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_3_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_280,&local_288);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_1e0,local_208,local_230,(Arguments)local_258,(function *)0x0,
                      SUB81(&local_280,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"-O2",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"execute -O2 optimization passes (most opts, generally gets most perf)",
             &local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"Optimization options",&local_321);
  local_350.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_4_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_348,&local_350);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_2a8,local_2d0,local_2f8,(Arguments)local_320,(function *)0x0,
                      SUB81(&local_348,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"-O3",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,
             "execute -O3 optimization passes (spends potentially a lot of time optimizing)",
             &local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"Optimization options",&local_3e9);
  local_418.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_5_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_410,&local_418);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_370,local_398,local_3c0,(Arguments)local_3e8,(function *)0x0,
                      SUB81(&local_410,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"-O4",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,
             "execute -O4 optimization passes (also flatten the IR, which can take a lot more time and memory, but is useful on more nested / complex / less-optimized input)"
             ,&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"Optimization options",&local_4b1);
  local_4e0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_6_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4d8,&local_4e0);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_438,local_460,local_488,(Arguments)local_4b0,(function *)0x0,
                      SUB81(&local_4d8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_528,"-Os",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"execute default optimization passes, focusing on code size",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_578,"Optimization options",&local_579);
  local_5a8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_7_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5a0,&local_5a8);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_500,local_528,local_550,(Arguments)local_578,(function *)0x0,
                      SUB81(&local_5a0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"",&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,"-Oz",&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,"execute default optimization passes, super-focusing on code size",&local_619
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"Optimization options",&local_641);
  local_670.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_8_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_668,&local_670);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_5c8,local_5f0,local_618,(Arguments)local_640,(function *)0x0,
                      SUB81(&local_668,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_690,"--optimize-level",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"-ol",&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"How much to focus on optimizing code",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_708,"Optimization options",&local_709);
  local_738.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_9_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_730,&local_738);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_690,local_6b8,local_6e0,(Arguments)local_708,(function *)0x1,
                      SUB81(&local_730,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"--shrink-level",&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_780,"-s",&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a8,"How much to focus on shrinking code size",&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"Optimization options",&local_7d1);
  local_800.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_10_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_7f8,&local_800);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_758,local_780,local_7a8,(Arguments)local_7d0,(function *)0x1,
                      SUB81(&local_7f8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"--debuginfo",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_848,"-g",&local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_870,"Emit names section in wasm binary (or full debuginfo in wast)",&local_871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"Optimization options",&local_899);
  local_8c8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_11_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_8c0,&local_8c8);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_820,local_848,local_870,(Arguments)local_898,(function *)0x0,
                      SUB81(&local_8c0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e8,"--always-inline-max-function-size",&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_910,"-aimfs",&local_911);
  local_998.alwaysInlineMaxSize = 0;
  local_998.oneCallerInlineMaxSize = 0;
  local_998.flexibleInlineMaxSize = 0;
  local_998.allowFunctionsWithLoops = false;
  local_998._13_3_ = 0;
  local_998.partialInliningIfs = 0;
  InliningOptions::InliningOptions(&local_998);
  std::__cxx11::to_string(&local_978,2);
  std::operator+(&local_958,"Max size of functions that are always inlined (default ",&local_978);
  std::operator+(&local_938,&local_958,", which is safe for use with -Os builds)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9b8,"Optimization options",&local_9b9);
  local_9e8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_12_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9e0,&local_9e8);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_8e8,local_910,(string *)&local_938,(Arguments)local_9b8,
                      (function *)0x1,SUB81(&local_9e0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a08,"--flexible-inline-max-function-size",&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a30,"-fimfs",&local_a31);
  local_a98.alwaysInlineMaxSize = 0;
  local_a98.oneCallerInlineMaxSize = 0;
  local_a98.flexibleInlineMaxSize = 0;
  local_a98.allowFunctionsWithLoops = false;
  local_a98._13_3_ = 0;
  local_a98.partialInliningIfs = 0;
  InliningOptions::InliningOptions(&local_a98);
  std::__cxx11::to_string(&local_a78,0x14);
  std::operator+(&local_a58,
                 "Max size of functions that are inlined when lightweight (no loops or function calls) when optimizing aggressively for speed (-O3). Default: "
                 ,&local_a78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ab8,"Optimization options",&local_ab9);
  local_ae8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_13_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ae0,&local_ae8);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_a08,local_a30,(string *)&local_a58,(Arguments)local_ab8,
                      (function *)0x1,SUB81(&local_ae0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b08,"--one-caller-inline-max-function-size",&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b30,"-ocimfs",&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b58,
             "Max size of functions that are inlined when there is only one caller (default -1, which means all such functions are inlined)"
             ,&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b80,"Optimization options",&local_b81);
  local_bb0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_14_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ba8,&local_bb0);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_b08,local_b30,local_b58,(Arguments)local_b80,(function *)0x1,
                      SUB81(&local_ba8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bd0,"--inline-functions-with-loops",&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"-ifwl",&local_bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c20,"Allow inlining functions with loops",&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c48,"Optimization options",&local_c49);
  local_c78.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_15_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c70,&local_c78);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_bd0,local_bf8,local_c20,(Arguments)local_c48,(function *)0x0,
                      SUB81(&local_c70,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c98,"--partial-inlining-ifs",&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cc0,"-pii",&local_cc1);
  local_d48.alwaysInlineMaxSize = 0;
  local_d48.oneCallerInlineMaxSize = 0;
  local_d48.flexibleInlineMaxSize = 0;
  local_d48.allowFunctionsWithLoops = false;
  local_d48._13_3_ = 0;
  local_d48.partialInliningIfs = 0;
  InliningOptions::InliningOptions(&local_d48);
  std::__cxx11::to_string(&local_d28,0);
  std::operator+(&local_d08,
                 "Number of ifs allowed in partial inlining (zero means partial inlining is disabled) (default: "
                 ,&local_d28);
  std::operator+(&local_ce8,&local_d08,')');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d68,"Optimization options",&local_d69);
  local_d98.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_16_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_d90,&local_d98);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_c98,local_cc0,(string *)&local_ce8,(Arguments)local_d68,
                      (function *)0x1,SUB81(&local_d90,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_db8,"--ignore-implicit-traps",&local_db9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_de0,"-iit",&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e08,
             "Optimize under the helpful assumption that no surprising traps occur (from load, div/mod, etc.)"
             ,&local_e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e30,"Optimization options",&local_e31);
  local_e60.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_17_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_e58,&local_e60);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_db8,local_de0,local_e08,(Arguments)local_e30,(function *)0x0,
                      SUB81(&local_e58,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e80,"--traps-never-happen",&local_e81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ea8,"-tnh",&local_ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ed0,
             "Optimize under the helpful assumption that no trap is reached at runtime (from load, div/mod, etc.)"
             ,&local_ed1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ef8,"Optimization options",&local_ef9);
  local_f28.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_18_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f20,&local_f28);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_e80,local_ea8,local_ed0,(Arguments)local_ef8,(function *)0x0,
                      SUB81(&local_f20,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f48,"--low-memory-unused",&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f70,"-lmu",&local_f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f98,
             "Optimize under the helpful assumption that the low 1K of memory is not used by the application"
             ,&local_f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fc0,"Optimization options",&local_fc1);
  local_ff0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_19_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_fe8,&local_ff0);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_f48,local_f70,local_f98,(Arguments)local_fc0,(function *)0x0,
                      SUB81(&local_fe8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1010,"--fast-math",&local_1011);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1038,"-ffm",&local_1039);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1060,"Optimize floats without handling corner cases of NaNs and rounding",
             &local_1061);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1088,"Optimization options",&local_1089);
  local_10b8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_20_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_10b0,&local_10b8);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_1010,local_1038,local_1060,(Arguments)local_1088,(function *)0x0,
                      SUB81(&local_10b0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10d8,"--zero-filled-memory",&local_10d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1100,"-uim",&local_1101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1128,"Assume that an imported memory will be zero-initialized",&local_1129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1150,"Optimization options",&local_1151);
  local_1180.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_21_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1178,&local_1180);
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,local_10d8,local_1100,local_1128,(Arguments)local_1150,(function *)0x0,
                      SUB81(&local_1178,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11a0,"--skip-pass",&local_11a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11c8,"-sp",&local_11c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_11f0,"Skip a pass (do not run it)",&local_11f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1218,"Optimization options",&local_1219);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_22_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1240,
             (anon_class_8_1_8991fb9c *)&__range2);
  ::wasm::Options::add
            (psVar2,local_11a0,local_11c8,local_11f0,(Arguments)local_1218,(function *)0x1,
             SUB81(&local_1240,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1240);
  std::__cxx11::string::~string(local_1218);
  std::allocator<char>::~allocator(&local_1219);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::~allocator(&local_11f1);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator(&local_11c9);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator(&local_11a1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1178);
  std::__cxx11::string::~string(local_1150);
  std::allocator<char>::~allocator(&local_1151);
  std::__cxx11::string::~string(local_1128);
  std::allocator<char>::~allocator(&local_1129);
  std::__cxx11::string::~string(local_1100);
  std::allocator<char>::~allocator(&local_1101);
  std::__cxx11::string::~string(local_10d8);
  std::allocator<char>::~allocator(&local_10d9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_10b0);
  std::__cxx11::string::~string(local_1088);
  std::allocator<char>::~allocator(&local_1089);
  std::__cxx11::string::~string(local_1060);
  std::allocator<char>::~allocator(&local_1061);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator(&local_1039);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator(&local_1011);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_fe8);
  std::__cxx11::string::~string(local_fc0);
  std::allocator<char>::~allocator(&local_fc1);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::__cxx11::string::~string(local_f70);
  std::allocator<char>::~allocator(&local_f71);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator(&local_f49);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f20);
  std::__cxx11::string::~string(local_ef8);
  std::allocator<char>::~allocator(&local_ef9);
  std::__cxx11::string::~string(local_ed0);
  std::allocator<char>::~allocator(&local_ed1);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator(&local_ea9);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator(&local_e81);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_e58);
  std::__cxx11::string::~string(local_e30);
  std::allocator<char>::~allocator(&local_e31);
  std::__cxx11::string::~string(local_e08);
  std::allocator<char>::~allocator(&local_e09);
  std::__cxx11::string::~string(local_de0);
  std::allocator<char>::~allocator(&local_de1);
  std::__cxx11::string::~string(local_db8);
  std::allocator<char>::~allocator(&local_db9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_d90);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator(&local_d69);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator(&local_c99);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c70);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator(&local_c49);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator(&local_c21);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator(&local_bf9);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ba8);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ae0);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a78);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator(&local_a31);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9e0);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator(&local_911);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_8c0);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator(&local_871);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7f8);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_730);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator(&local_691);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_668);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5a0);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4d8);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_410);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  ::wasm::PassRegistry::get();
  ::wasm::PassRegistry::getRegisteredNames_abi_cxx11_();
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2);
  p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar1) break;
    local_1280 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c0,"--",&local_12c1);
    std::operator+(&local_12a0,&local_12c0,local_1280);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_12e8,"",&local_12e9);
    uVar3 = ::wasm::PassRegistry::get();
    std::__cxx11::string::string(local_1330,(string *)local_1280);
    ::wasm::PassRegistry::getPassDescription(local_1310,uVar3,local_1330);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1350,"Optimization passes",&local_1351)
    ;
    local_13a0.this = this;
    std::__cxx11::string::string((string *)&local_13a0.p,(string *)local_1280);
    std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
    function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_23_,void>
              ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1378,&local_13a0
              );
    uVar3 = ::wasm::PassRegistry::get();
    std::__cxx11::string::string(local_13c0,(string *)local_1280);
    ::wasm::PassRegistry::isPassHidden(uVar3,local_13c0);
    ::wasm::Options::add
              ((string *)this,(string *)&local_12a0,local_12e8,local_1310,(Arguments)local_1350,
               (function *)0x3,SUB81(&local_1378,0));
    std::__cxx11::string::~string(local_13c0);
    std::
    function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_1378);
    OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::
    {lambda(wasm::Options*,std::__cxx11::string_const&)#23}::~Options
              ((_lambda_wasm__Options__std____cxx11__string_const___23_ *)&local_13a0);
    std::__cxx11::string::~string(local_1350);
    std::allocator<char>::~allocator(&local_1351);
    std::__cxx11::string::~string(local_1310);
    std::__cxx11::string::~string(local_1330);
    std::__cxx11::string::~string(local_12e8);
    std::allocator<char>::~allocator(&local_12e9);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::__cxx11::string::~string((string *)&local_12c0);
    std::allocator<char>::~allocator(&local_12c1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  return;
}

Assistant:

OptimizationOptions(const std::string& command,
                      const std::string& description)
    : ToolOptions(command, description) {
    (*this)
      .add(
        "",
        "-O",
        "execute default optimization passes (equivalent to -Os)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.setDefaultOptimizationOptions();
          static_assert(
            PassOptions::DEFAULT_OPTIMIZE_LEVEL == OS_OPTIMIZE_LEVEL &&
              PassOptions::DEFAULT_SHRINK_LEVEL == OS_SHRINK_LEVEL,
            "Help text states that -O is equivalent to -Os but now it isn't.");
          addDefaultOptPasses();
        })
      .add("",
           "-O0",
           "execute no optimization passes",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 0;
             passOptions.shrinkLevel = 0;
           })
      .add("",
           "-O1",
           "execute -O1 optimization passes (quick&useful opts, useful for "
           "iteration builds)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 1;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add(
        "",
        "-O2",
        "execute -O2 optimization passes (most opts, generally gets most perf)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.optimizeLevel = 2;
          passOptions.shrinkLevel = 0;
          addDefaultOptPasses();
        })
      .add("",
           "-O3",
           "execute -O3 optimization passes (spends potentially a lot of time "
           "optimizing)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 3;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-O4",
           "execute -O4 optimization passes (also flatten the IR, which can "
           "take a lot more time and memory, but is useful on more nested / "
           "complex / less-optimized input)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 4;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-Os",
           "execute default optimization passes, focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = OS_OPTIMIZE_LEVEL;
             passOptions.shrinkLevel = OS_SHRINK_LEVEL;
             addDefaultOptPasses();
           })
      .add("",
           "-Oz",
           "execute default optimization passes, super-focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 2;
             passOptions.shrinkLevel = 2;
             addDefaultOptPasses();
           })
      .add("--optimize-level",
           "-ol",
           "How much to focus on optimizing code",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.optimizeLevel = atoi(argument.c_str());
           })
      .add("--shrink-level",
           "-s",
           "How much to focus on shrinking code size",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.shrinkLevel = atoi(argument.c_str());
           })
      .add("--debuginfo",
           "-g",
           "Emit names section in wasm binary (or full debuginfo in wast)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.debugInfo = true;
           })
      .add("--always-inline-max-function-size",
           "-aimfs",
           "Max size of functions that are always inlined (default " +
             std::to_string(InliningOptions().alwaysInlineMaxSize) +
             ", which "
             "is safe for use with -Os builds)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.alwaysInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--flexible-inline-max-function-size",
           "-fimfs",
           "Max size of functions that are inlined when lightweight (no loops "
           "or function calls) when optimizing aggressively for speed (-O3). "
           "Default: " +
             std::to_string(InliningOptions().flexibleInlineMaxSize),
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.flexibleInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--one-caller-inline-max-function-size",
           "-ocimfs",
           "Max size of functions that are inlined when there is only one "
           "caller (default -1, which means all such functions are inlined)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             static_assert(InliningOptions().oneCallerInlineMaxSize ==
                             Index(-1),
                           "the help text here is written to assume -1");
             passOptions.inlining.oneCallerInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--inline-functions-with-loops",
           "-ifwl",
           "Allow inlining functions with loops",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string&) {
             passOptions.inlining.allowFunctionsWithLoops = true;
           })
      .add("--partial-inlining-ifs",
           "-pii",
           "Number of ifs allowed in partial inlining (zero means partial "
           "inlining is disabled) (default: " +
             std::to_string(InliningOptions().partialInliningIfs) + ')',
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.partialInliningIfs =
               static_cast<Index>(std::stoi(argument));
           })
      .add("--ignore-implicit-traps",
           "-iit",
           "Optimize under the helpful assumption that no surprising traps "
           "occur (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.ignoreImplicitTraps = true;
           })
      .add("--traps-never-happen",
           "-tnh",
           "Optimize under the helpful assumption that no trap is reached at "
           "runtime (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.trapsNeverHappen = true;
           })
      .add("--low-memory-unused",
           "-lmu",
           "Optimize under the helpful assumption that the low 1K of memory is "
           "not used by the application",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.lowMemoryUnused = true;
           })
      .add(
        "--fast-math",
        "-ffm",
        "Optimize floats without handling corner cases of NaNs and rounding",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) { passOptions.fastMath = true; })
      .add("--zero-filled-memory",
           "-uim",
           "Assume that an imported memory will be zero-initialized",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.zeroFilledMemory = true;
           })
      .add("--skip-pass",
           "-sp",
           "Skip a pass (do not run it)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options*, const std::string& pass) {
             passOptions.passesToSkip.insert(pass);
           });

    // add passes in registry
    for (const auto& p : PassRegistry::get()->getRegisteredNames()) {
      (*this).add(
        std::string("--") + p,
        "",
        PassRegistry::get()->getPassDescription(p),
        "Optimization passes",
        // Allow an optional parameter to a pass. If provided, it is
        // the same as if using --pass-arg, that is,
        //
        //   --foo=ARG
        //
        // is the same as
        //
        //   --foo --pass-arg=foo@ARG
        Options::Arguments::Optional,
        [this, p](Options*, const std::string& arg) {
          if (!arg.empty()) {
            if (passOptions.arguments.count(p)) {
              Fatal() << "Cannot pass multiple pass arguments to " << p;
            }
            passOptions.arguments[p] = arg;
          }
          passes.push_back(p);
        },
        PassRegistry::get()->isPassHidden(p));
    }
  }